

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_completepath(char *from,char *to,int bufsize,_glist *x)

{
  char *__s;
  int iVar1;
  t_symbol *ptVar2;
  size_t sVar3;
  int dirlen;
  char *dir;
  _glist *x_local;
  int bufsize_local;
  char *to_local;
  char *from_local;
  
  iVar1 = sys_isabsolutepath(from);
  if (iVar1 == 0) {
    if (x == (_glist *)0x0) {
      strncpy(to,sys_libdir->s_name,(long)(bufsize + -10));
      to[bufsize + -9] = '\0';
      strcat(to,"/extra/");
    }
    else {
      ptVar2 = canvas_getdir(x);
      __s = ptVar2->s_name;
      sVar3 = strlen(__s);
      strncpy(to,__s,(long)(bufsize - (int)sVar3));
      to[(bufsize - (int)sVar3) + -1] = '\0';
      strcat(to,"/");
    }
  }
  else {
    *to = '\0';
  }
  sVar3 = strlen(to);
  strncat(to,from,(long)bufsize - sVar3);
  to[bufsize + -1] = '\0';
  return;
}

Assistant:

static void canvas_completepath(const char *from, char *to, int bufsize,
    t_canvas *x)
{
    if (sys_isabsolutepath(from))
    {
        to[0] = '\0';
    }
    else if (x)
    {
        /* append canvas dir */
        const char *dir = canvas_getdir(x)->s_name;
        int dirlen = (int)strlen(dir);
        strncpy(to, dir, bufsize-dirlen);
        to[bufsize-dirlen-1] = '\0';
        strcat(to, "/");
    }
     else
    {   /* append Pd lib dir */
        strncpy(to, sys_libdir->s_name, bufsize-10);
        to[bufsize-9] = '\0';
        strcat(to, "/extra/");
    }
    strncat(to, from, bufsize-strlen(to));
    to[bufsize-1] = '\0';
}